

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  internal *piVar1;
  size_t *__return_storage_ptr__;
  FILE *__stream;
  bool bVar2;
  __type_conflict _Var3;
  size_type sVar4;
  _Rb_tree_node_base *p_Var5;
  int line_00;
  char *pcVar6;
  char *extraout_RDX;
  char *str;
  char *extraout_RDX_00;
  internal *this_00;
  string *name;
  undefined1 __x [8];
  string local_e8;
  undefined1 local_c8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message errors;
  
  *this = (TypedTestCasePState)0x1;
  auStack_68 = (undefined1  [8])0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (internal *)(registered_tests + -1);
  pcVar6 = registered_tests;
  do {
    piVar1 = this_00 + 1;
    this_00 = this_00 + 1;
    bVar2 = IsSpace((char)*piVar1);
  } while (bVar2);
  __return_storage_ptr__ = &tests._M_t._M_impl.super__Rb_tree_header._M_node_count;
  str = extraout_RDX;
  while (this_00 != (internal *)0x0) {
    GetPrefixUntilComma_abi_cxx11_((string *)__return_storage_ptr__,this_00,str);
    StripTrailingSpaces((string *)local_c8,(string *)__return_storage_ptr__);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    this_00 = (internal *)SkipComma((char *)this_00);
    str = extraout_RDX_00;
  }
  Message::Message((Message *)&local_38);
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tests;
  tests._M_t._M_impl._0_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __x = auStack_68;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (__x == (undefined1  [8])
               name_vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
      for (p_Var5 = *(_Rb_tree_node_base **)(this + 0x20); line_00 = (int)pcVar6,
          p_Var5 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c8,(key_type *)(p_Var5 + 1));
        if (sVar4 == 0) {
          std::operator<<((ostream *)(local_38.ptr_ + 0x10),"You forgot to list test ");
          std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)(p_Var5 + 1));
          std::operator<<((ostream *)(local_38.ptr_ + 0x10),".\n");
        }
      }
      StringStreamToString
                ((string *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count,local_38.ptr_);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
      __stream = _stderr;
      if (!bVar2) {
        std::__cxx11::string::~string
                  ((string *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c8);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
        return registered_tests;
      }
      FormatFileLocation_abi_cxx11_(&local_e8,(internal *)file,(char *)(ulong)(uint)line,line_00);
      fprintf(__stream,"%s %s",local_e8._M_dataplus._M_p,
              tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_e8);
      fflush(_stderr);
      abort();
    }
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c8,(key_type *)__x);
    if (sVar4 == 0) {
      for (p_Var5 = *(_Rb_tree_node_base **)(this + 0x20);
          p_Var5 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var5 + 1));
        if (_Var3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
          goto LAB_00162f4c;
        }
      }
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),"No test named ");
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)__x);
      std::operator<<((ostream *)(local_38.ptr_ + 0x10)," can be found in this test case.\n");
    }
    else {
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),"Test ");
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)__x);
      std::operator<<((ostream *)(local_38.ptr_ + 0x10)," is listed more than once.\n");
    }
LAB_00162f4c:
    __x = (undefined1  [8])((long)__x + 0x20);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}